

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::CheckerInstanceSymbol::visitExprs<register_has_no_reset::AlwaysFFVisitor&>
          (CheckerInstanceSymbol *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  reference pCVar2;
  Expression *expr;
  Connection *conn;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> *__range2;
  CheckerInstanceSymbol *in_stack_000000c0;
  AlwaysFFVisitor *in_stack_ffffffffffffffa8;
  Expression *in_stack_ffffffffffffffb0;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> local_28;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> *local_18;
  
  local_28 = getPortConnections(in_stack_000000c0);
  local_18 = &local_28;
  local_30._M_current =
       (Connection *)
       std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
                   *)in_stack_ffffffffffffffa8);
  std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
             ::operator*(&local_30);
    if (pCVar2->formal->kind == FormalArgument) {
      std::
      visit<slang::ast::CheckerInstanceSymbol::visitExprs<register_has_no_reset::AlwaysFFVisitor&>(register_has_no_reset::AlwaysFFVisitor&)const::_lambda(auto:1&&)_1_,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>const&>
                ((anon_class_8_1_9f2c674e *)in_stack_ffffffffffffffb0,
                 (variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                  *)in_stack_ffffffffffffffa8);
    }
    in_stack_ffffffffffffffb0 = Connection::getOutputInitialExpr((Connection *)__range2);
    if (in_stack_ffffffffffffffb0 != (Expression *)0x0) {
      Expression::visit<register_has_no_reset::AlwaysFFVisitor&>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void CheckerInstanceSymbol::visitExprs(TVisitor&& visitor) const {
    for (auto& conn : getPortConnections()) {
        // Note: we only visit output arguments here, since input arguments
        // get rewritten into the checker instance body.
        if (conn.formal.kind == SymbolKind::FormalArgument) {
            std::visit(
                [&](auto&& arg) {
                    if (arg)
                        arg->visit(visitor);
                },
                conn.actual);
        }
        if (auto expr = conn.getOutputInitialExpr())
            expr->visit(visitor);
    }
}